

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O1

bool Imf_3_2::anon_unknown_0::readScanline<Imf_3_2::InputFile>
               (InputFile *in,bool reduceMemory,bool reduceTime)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  pointer puVar4;
  pointer pfVar5;
  pointer phVar6;
  int iVar7;
  int *piVar8;
  Header *pHVar9;
  Compression *pCVar10;
  _Rb_tree_node_base *p_Var11;
  _Rb_tree_node_base *p_Var12;
  size_type __n;
  ulong uVar13;
  vector<unsigned_int,_std::allocator<unsigned_int>_> uintChannels;
  vector<float,_std::allocator<float>_> floatChannels;
  vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> halfChannels;
  FrameBuffer i;
  allocator_type local_68 [56];
  
  Imf_3_2::InputFile::header();
  piVar8 = (int *)Imf_3_2::Header::dataWindow();
  iVar7 = piVar8[2];
  iVar1 = *piVar8;
  pHVar9 = (Header *)Imf_3_2::InputFile::header();
  Imf_3_2::calculateBytesPerPixel(pHVar9);
  Imf_3_2::InputFile::header();
  pCVar10 = (Compression *)Imf_3_2::Header::compression();
  Imf_3_2::numLinesInBuffer(*pCVar10);
  __n = ((long)iVar7 - (long)iVar1) + 1;
  i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &i._map._M_t._M_impl.super__Rb_tree_header._M_header;
  i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  i._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::vector(&halfChannels,__n,local_68)
  ;
  std::vector<float,_std::allocator<float>_>::vector(&floatChannels,__n,(allocator_type *)local_68);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&uintChannels,__n,(allocator_type *)local_68);
  phVar6 = halfChannels.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pfVar5 = floatChannels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = uintChannels.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  Imf_3_2::InputFile::header();
  Imf_3_2::Header::channels();
  p_Var11 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
  uVar13 = 0;
  for (; p_Var12 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end(), p_Var11 != p_Var12;
      p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
    iVar7 = (int)uVar13 + (int)(uVar13 / 3) * -3;
    if (iVar7 == 2) {
      Imf_3_2::Slice::Slice
                ((Slice *)local_68,UINT,
                 (char *)(puVar4 + -(long)(iVar1 / *(int *)&p_Var11[9].field_0x4)),4,0,
                 *(int *)&p_Var11[9].field_0x4,*(int *)&p_Var11[9]._M_parent,0.0,false,false);
      Imf_3_2::FrameBuffer::insert((char *)&i,(Slice *)(p_Var11 + 1));
    }
    else if (iVar7 == 1) {
      Imf_3_2::Slice::Slice
                ((Slice *)local_68,FLOAT,
                 (char *)(pfVar5 + -(long)(iVar1 / *(int *)&p_Var11[9].field_0x4)),4,0,
                 *(int *)&p_Var11[9].field_0x4,*(int *)&p_Var11[9]._M_parent,0.0,false,false);
      Imf_3_2::FrameBuffer::insert((char *)&i,(Slice *)(p_Var11 + 1));
    }
    else {
      Imf_3_2::Slice::Slice
                ((Slice *)local_68,HALF,
                 (char *)(phVar6 + -(long)(iVar1 / *(int *)&p_Var11[9].field_0x4)),2,0,
                 *(int *)&p_Var11[9].field_0x4,*(int *)&p_Var11[9]._M_parent,0.0,false,false);
      Imf_3_2::FrameBuffer::insert((char *)&i,(Slice *)(p_Var11 + 1));
    }
    uVar13 = (ulong)((int)uVar13 + 1);
  }
  Imf_3_2::InputFile::setFrameBuffer((FrameBuffer *)in);
  iVar7 = piVar8[1];
  bVar3 = piVar8[3] < iVar7;
  if (iVar7 <= piVar8[3]) {
    do {
      Imf_3_2::InputFile::readPixels((int)in);
      bVar3 = piVar8[3] <= iVar7;
      bVar2 = iVar7 < piVar8[3];
      iVar7 = iVar7 + 1;
    } while (bVar2);
  }
  if (uintChannels.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(uintChannels.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)uintChannels.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)uintChannels.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (floatChannels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(floatChannels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)floatChannels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)floatChannels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (halfChannels.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(halfChannels.
                    super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)halfChannels.
                          super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)halfChannels.
                          super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
               *)&i);
  return !bVar3;
}

Assistant:

bool
readScanline (T& in, bool reduceMemory, bool reduceTime)
{

    bool threw = false;

    try
    {
        const Box2i& dw = in.header ().dataWindow ();

        uint64_t w = static_cast<uint64_t> (dw.max.x) -
                     static_cast<uint64_t> (dw.min.x) + 1;
        int      dx            = dw.min.x;
        uint64_t bytesPerPixel = calculateBytesPerPixel (in.header ());
        uint64_t numLines      = numLinesInBuffer (in.header ().compression ());

        if (reduceMemory && w * bytesPerPixel * numLines > gMaxBytesPerScanline)
        {
            return false;
        }

        FrameBuffer i;

        // read all channels present (later channels will overwrite earlier ones)
        vector<half>         halfChannels (w);
        vector<float>        floatChannels (w);
        vector<unsigned int> uintChannels (w);

        intptr_t halfData  = reinterpret_cast<intptr_t> (halfChannels.data ());
        intptr_t floatData = reinterpret_cast<intptr_t> (floatChannels.data ());
        intptr_t uintData  = reinterpret_cast<intptr_t> (uintChannels.data ());

        int                channelIndex = 0;
        const ChannelList& channelList  = in.header ().channels ();
        for (ChannelList::ConstIterator c = channelList.begin ();
             c != channelList.end ();
             ++c)
        {
            switch (channelIndex % 3)
            {
                case 0:
                    i.insert(c.name(),Slice(HALF, (char*) (halfData - sizeof(half)*(dx/c.channel().xSampling))  , sizeof(half) , 0 , c.channel().xSampling , c.channel().ySampling ));
                    break;
                case 1:
                    i.insert(c.name(),Slice(FLOAT, (char*) (floatData - sizeof(float)*(dx/c.channel().xSampling))  , sizeof(float) , 0 , c.channel().xSampling , c.channel().ySampling ));
                    break;
                case 2:
                    i.insert(c.name(),Slice(UINT, (char*) (uintData - sizeof(unsigned int)*(dx/c.channel().xSampling))  , sizeof(unsigned int) , 0 , c.channel().xSampling , c.channel().ySampling ));
                    break;
            }
            channelIndex++;
        }

        in.setFrameBuffer (i);

        int step = 1;

        //
        // try reading scanlines. Continue reading scanlines
        // even if an exception is encountered
        //
        for (int y = dw.min.y; y <= dw.max.y; y += step)
        {
            try
            {
                in.readPixels (y);
            }
            catch (...)
            {
                threw = true;

                //
                // in reduceTime mode, fail immediately - the file is corrupt
                //
                if (reduceTime) { return threw; }
            }
        }
    }
    catch (...)
    {
        threw = true;
    }

    return threw;
}